

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingPreparedStatement
          (ClientContext *this,ClientContextLock *lock,string *query,
          shared_ptr<duckdb::PreparedStatementData,_true> *prepared,
          PendingQueryParameters *parameters)

{
  bool bVar1;
  int iVar2;
  type pPVar3;
  PreparedStatementData *this_00;
  pointer this_01;
  ClientContextState *pCVar4;
  shared_ptr<duckdb::PreparedStatementData,_true> *statement_p;
  PendingQueryParameters *in_R9;
  shared_ptr<duckdb::ClientContextState,_true> *state;
  pointer this_02;
  PreparedStatementCallbackInfo info;
  __shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2> local_68;
  type local_58 [2];
  vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
  local_48;
  
  pPVar3 = shared_ptr<duckdb::PreparedStatementData,_true>::operator*
                     ((shared_ptr<duckdb::PreparedStatementData,_true> *)parameters);
  CheckIfPreparedStatementIsExecutable((ClientContext *)lock,pPVar3);
  this_00 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                      ((shared_ptr<duckdb::PreparedStatementData,_true> *)parameters);
  bVar1 = PreparedStatementData::RequireRebind
                    (this_00,(ClientContext *)lock,(in_R9->parameters).ptr);
  this_01 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
            ::operator->((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                          *)(lock + 5));
  RegisteredStateManager::States
            ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)&local_48,this_01
            );
  for (this_02 = local_48.
                 super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_02 !=
      local_48.
      super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_02 = this_02 + 1) {
    local_58[0] = shared_ptr<duckdb::PreparedStatementData,_true>::operator*
                            ((shared_ptr<duckdb::PreparedStatementData,_true> *)parameters);
    pCVar4 = shared_ptr<duckdb::ClientContextState,_true>::operator->(this_02);
    this_01 = (pointer)lock;
    iVar2 = (**(code **)(*(long *)pCVar4 + 0x68))(pCVar4,lock,local_58,bVar1);
    if (iVar2 == 1) {
      bVar1 = true;
    }
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
  ::~vector(&local_48);
  if (bVar1 == true) {
    RebindPreparedStatement
              ((ClientContext *)lock,(ClientContextLock *)this_01,(string *)prepared,
               (shared_ptr<duckdb::PreparedStatementData,_true> *)parameters,in_R9);
    pPVar3 = shared_ptr<duckdb::PreparedStatementData,_true>::operator*
                       ((shared_ptr<duckdb::PreparedStatementData,_true> *)parameters);
    CheckIfPreparedStatementIsExecutable((ClientContext *)lock,pPVar3);
  }
  ::std::__shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             (__shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2> *)parameters);
  PendingPreparedStatementInternal(this,lock,statement_p,(PendingQueryParameters *)&local_68);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingPreparedStatement(ClientContextLock &lock, const string &query,
                                                                       shared_ptr<PreparedStatementData> prepared,
                                                                       const PendingQueryParameters &parameters) {
	CheckIfPreparedStatementIsExecutable(*prepared);

	RebindQueryInfo rebind = RebindQueryInfo::DO_NOT_REBIND;
	if (prepared->RequireRebind(*this, parameters.parameters)) {
		rebind = RebindQueryInfo::ATTEMPT_TO_REBIND;
	}

	for (auto &state : registered_state->States()) {
		PreparedStatementCallbackInfo info(*prepared, parameters);
		auto new_rebind = state->OnExecutePrepared(*this, info, rebind);
		if (new_rebind == RebindQueryInfo::ATTEMPT_TO_REBIND) {
			rebind = RebindQueryInfo::ATTEMPT_TO_REBIND;
		}
	}
	if (rebind == RebindQueryInfo::ATTEMPT_TO_REBIND) {
		RebindPreparedStatement(lock, query, prepared, parameters);
		CheckIfPreparedStatementIsExecutable(*prepared); // rerun this too as modified_databases might have changed
	}
	return PendingPreparedStatementInternal(lock, prepared, parameters);
}